

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yang_print_unique(lyout *out,int level,lys_module *module,lys_unique *uniq)

{
  char *value;
  char *pcVar1;
  char *str;
  int i;
  lys_unique *uniq_local;
  lys_module *module_local;
  int level_local;
  lyout *out_local;
  
  ly_print(out,"%*sunique \"",(ulong)(uint)(level << 1),"");
  for (str._4_4_ = 0; str._4_4_ < (int)(uint)uniq->expr_size; str._4_4_ = str._4_4_ + 1) {
    value = transform_json2schema(module,uniq->expr[str._4_4_]);
    pcVar1 = "";
    if (str._4_4_ + 1 < (int)(uint)uniq->expr_size) {
      pcVar1 = " ";
    }
    ly_print(out,"%s%s",value,pcVar1);
    lydict_remove(module->ctx,value);
  }
  ly_print(out,"\"");
  return;
}

Assistant:

static void
yang_print_unique(struct lyout *out, int level, const struct lys_module *module, const struct lys_unique *uniq)
{
    int i;
    const char *str;

    ly_print(out, "%*sunique \"", LEVEL, INDENT);
    for (i = 0; i < uniq->expr_size; i++) {
        str = transform_json2schema(module, uniq->expr[i]);
        ly_print(out, "%s%s", str, i + 1 < uniq->expr_size ? " " : "");
        lydict_remove(module->ctx, str);
    }
    ly_print(out, "\"");
}